

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O0

void compile_finish(c2m_ctx_t c2m_ctx)

{
  c2m_ctx_t c2m_ctx_local;
  
  if (c2m_ctx->symbol_text != (VARR_char *)0x0) {
    VARR_chardestroy(&c2m_ctx->symbol_text);
  }
  if (c2m_ctx->temp_string != (VARR_char *)0x0) {
    VARR_chardestroy(&c2m_ctx->temp_string);
  }
  if (c2m_ctx->node_positions != (VARR_pos_t *)0x0) {
    VARR_pos_tdestroy(&c2m_ctx->node_positions);
  }
  parse_finish(c2m_ctx);
  context_finish(c2m_ctx);
  if (c2m_ctx->headers != (VARR_char_ptr_t *)0x0) {
    VARR_char_ptr_tdestroy(&c2m_ctx->headers);
  }
  if (c2m_ctx->system_headers != (VARR_char_ptr_t *)0x0) {
    VARR_char_ptr_tdestroy(&c2m_ctx->system_headers);
  }
  if (c2m_ctx->call_nodes != (VARR_node_t *)0x0) {
    VARR_node_tdestroy(&c2m_ctx->call_nodes);
  }
  if (c2m_ctx->containing_anon_members != (VARR_node_t *)0x0) {
    VARR_node_tdestroy(&c2m_ctx->containing_anon_members);
  }
  if (c2m_ctx->init_object_path != (VARR_init_object_t *)0x0) {
    VARR_init_object_tdestroy(&c2m_ctx->init_object_path);
  }
  return;
}

Assistant:

static void compile_finish (c2m_ctx_t c2m_ctx) {
  if (symbol_text != NULL) VARR_DESTROY (char, symbol_text);
  if (temp_string != NULL) VARR_DESTROY (char, temp_string);
  if (node_positions != NULL) VARR_DESTROY (pos_t, node_positions);
  parse_finish (c2m_ctx);
  context_finish (c2m_ctx);
  if (headers != NULL) VARR_DESTROY (char_ptr_t, headers);
  if (system_headers != NULL) VARR_DESTROY (char_ptr_t, system_headers);
  if (call_nodes != NULL) VARR_DESTROY (node_t, call_nodes);
  if (containing_anon_members != NULL) VARR_DESTROY (node_t, containing_anon_members);
  if (init_object_path != NULL) VARR_DESTROY (init_object_t, init_object_path);
}